

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

void lj_debug_dumpstack(lua_State *L,SBuf *sb,char *fmt,int depth)

{
  long lVar1;
  char *sb_00;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  byte *pbVar5;
  int32_t local_1ac;
  int local_19c;
  GCfunc *local_180;
  BCLine line;
  GCproto *pt_1;
  GCproto *pt;
  char *what;
  char *name;
  byte *pbStack_148;
  int c;
  uint8_t *p;
  GCfunc *fn;
  cTValue *nextframe;
  cTValue *frame;
  int size;
  MSize lastlen;
  int pathstrip;
  int dir;
  int level;
  int depth_local;
  char *fmt_local;
  SBuf *sb_local;
  lua_State *L_local;
  char *w_4;
  char *local_e8;
  char *local_e0;
  char *w_3;
  char *local_d0;
  char *local_c8;
  char *w_2;
  char *local_b8;
  char *local_b0;
  char *w_1;
  char *local_a0;
  char *local_98;
  char *w;
  char *local_88;
  undefined4 local_7c;
  char *local_78;
  char *local_70;
  undefined4 local_64;
  char *local_60;
  char *local_58;
  undefined4 local_4c;
  char *local_48;
  char *local_40;
  undefined4 local_34;
  char *local_30;
  char *local_28;
  undefined4 local_1c;
  char *local_18;
  char *local_10;
  
  pathstrip = 0;
  lastlen = 1;
  size = 1;
  frame._4_4_ = 0;
  dir = depth;
  _level = (byte *)fmt;
  fmt_local = (char *)sb;
  sb_local = (SBuf *)L;
  if (depth < 0) {
    pathstrip = depth ^ 0xffffffff;
    lastlen = 0xffffffff;
    dir = -1;
  }
  for (; pathstrip != dir; pathstrip = lastlen + pathstrip) {
    nextframe = lj_debug_frame((lua_State *)sb_local,pathstrip,(int *)&frame);
    if (nextframe == (cTValue *)0x0) {
      if (lastlen == 1) break;
      pathstrip = pathstrip - (int)frame;
    }
    else {
      if ((int)frame == 0) {
        local_180 = (GCfunc *)0x0;
      }
      else {
        local_180 = (GCfunc *)(nextframe + (int)frame);
      }
      fn = local_180;
      p = (uint8_t *)(nextframe[-1].u64 & 0x7fffffffffff);
      pbStack_148 = _level;
LAB_0011c526:
      pbVar5 = pbStack_148 + 1;
      name._4_4_ = (uint)*pbStack_148;
      pbStack_148 = pbVar5;
      if (name._4_4_ != 0) {
        switch(name._4_4_) {
        case 0x46:
        case 0x66:
          pcVar3 = lj_debug_funcname((lua_State *)sb_local,nextframe,&what);
          if (pcVar3 != (char *)0x0) {
            if (((name._4_4_ == 0x46) && (p[10] == '\0')) &&
               (*(int *)(*(long *)(p + 0x20) + -0x20) != -1)) {
              debug_putchunkname((SBuf *)fmt_local,(GCproto *)(*(long *)(p + 0x20) + -0x68),size);
              local_88 = fmt_local;
              w._4_4_ = 0x3a;
              local_78 = fmt_local;
              local_7c = 1;
              if ((int)*(undefined8 *)(fmt_local + 8) == (int)*(undefined8 *)fmt_local) {
                local_70 = lj_buf_more2((SBuf *)fmt_local,1);
              }
              else {
                local_70 = *(char **)fmt_local;
              }
              local_98 = local_70 + 1;
              *local_70 = (char)w._4_4_;
              *(char **)local_88 = local_98;
            }
            sb_00 = fmt_local;
            pcVar3 = what;
            sVar4 = strlen(what);
            lj_buf_putmem((SBuf *)sb_00,pcVar3,(MSize)sVar4);
            break;
          }
        case 0x6c:
          if (p[10] == '\0') {
            lVar1 = *(long *)(p + 0x20);
            iVar2 = debug_putchunkname((SBuf *)fmt_local,(GCproto *)(lVar1 + -0x68),size);
            if (iVar2 != 0) {
              if (name._4_4_ == 0x6c) {
                local_19c = debug_frameline((lua_State *)sb_local,(GCfunc *)p,(cTValue *)fn);
              }
              else {
                local_19c = *(int *)(lVar1 + -0x20);
              }
              local_a0 = fmt_local;
              w_1._4_4_ = 0x3a;
              local_60 = fmt_local;
              local_64 = 1;
              if ((int)*(undefined8 *)(fmt_local + 8) == (int)*(undefined8 *)fmt_local) {
                local_58 = lj_buf_more2((SBuf *)fmt_local,1);
              }
              else {
                local_58 = *(char **)fmt_local;
              }
              local_b0 = local_58 + 1;
              *local_58 = (char)w_1._4_4_;
              *(char **)local_a0 = local_b0;
              if (local_19c < 0) {
                local_1ac = *(int32_t *)(lVar1 + -0x20);
              }
              else {
                local_1ac = local_19c;
              }
              lj_strfmt_putint((SBuf *)fmt_local,local_1ac);
            }
          }
          else if (p[10] < 2) {
            local_d0 = fmt_local;
            w_3._4_4_ = 0x40;
            local_30 = fmt_local;
            local_34 = 1;
            if ((int)*(undefined8 *)(fmt_local + 8) == (int)*(undefined8 *)fmt_local) {
              local_28 = lj_buf_more2((SBuf *)fmt_local,1);
            }
            else {
              local_28 = *(char **)fmt_local;
            }
            local_e0 = local_28 + 1;
            *local_28 = (char)w_3._4_4_;
            *(char **)local_d0 = local_e0;
            lj_strfmt_putptr((SBuf *)fmt_local,*(void **)(p + 0x28));
          }
          else {
            lj_buf_putmem((SBuf *)fmt_local,"[builtin#",9);
            lj_strfmt_putint((SBuf *)fmt_local,(uint)p[10]);
            local_b8 = fmt_local;
            w_2._4_4_ = 0x5d;
            local_48 = fmt_local;
            local_4c = 1;
            if ((int)*(undefined8 *)(fmt_local + 8) == (int)*(undefined8 *)fmt_local) {
              local_40 = lj_buf_more2((SBuf *)fmt_local,1);
            }
            else {
              local_40 = *(char **)fmt_local;
            }
            local_c8 = local_40 + 1;
            *local_40 = (char)w_2._4_4_;
            *(char **)local_b8 = local_c8;
          }
          break;
        default:
          local_e8 = fmt_local;
          local_18 = fmt_local;
          local_1c = 1;
          w_4._4_4_ = name._4_4_;
          if ((int)*(undefined8 *)(fmt_local + 8) == (int)*(undefined8 *)fmt_local) {
            local_10 = lj_buf_more2((SBuf *)fmt_local,1);
          }
          else {
            local_10 = *(char **)fmt_local;
          }
          L_local = (lua_State *)(local_10 + 1);
          *local_10 = (char)w_4._4_4_;
          *(lua_State **)local_e8 = L_local;
          break;
        case 0x5a:
          frame._4_4_ = (int)*(undefined8 *)fmt_local - (int)*(undefined8 *)(fmt_local + 0x10);
          break;
        case 0x70:
          goto switchD_0011c57d_caseD_70;
        }
        goto LAB_0011c526;
      }
      name._4_4_ = 0;
    }
  }
  if (frame._4_4_ != 0) {
    *(ulong *)fmt_local = *(long *)(fmt_local + 0x10) + (ulong)frame._4_4_;
  }
  return;
switchD_0011c57d_caseD_70:
  size = 0;
  goto LAB_0011c526;
}

Assistant:

void lj_debug_dumpstack(lua_State *L, SBuf *sb, const char *fmt, int depth)
{
  int level = 0, dir = 1, pathstrip = 1;
  MSize lastlen = 0;
  if (depth < 0) { level = ~depth; depth = dir = -1; }  /* Reverse frames. */
  while (level != depth) {  /* Loop through all frame. */
    int size;
    cTValue *frame = lj_debug_frame(L, level, &size);
    if (frame) {
      cTValue *nextframe = size ? frame+size : NULL;
      GCfunc *fn = frame_func(frame);
      const uint8_t *p = (const uint8_t *)fmt;
      int c;
      while ((c = *p++)) {
	switch (c) {
	case 'p':  /* Preserve full path. */
	  pathstrip = 0;
	  break;
	case 'F': case 'f': {  /* Dump function name. */
	  const char *name;
	  const char *what = lj_debug_funcname(L, frame, &name);
	  if (what) {
	    if (c == 'F' && isluafunc(fn)) {  /* Dump module:name for 'F'. */
	      GCproto *pt = funcproto(fn);
	      if (pt->firstline != ~(BCLine)0) {  /* Not a bytecode builtin. */
		debug_putchunkname(sb, pt, pathstrip);
		lj_buf_putb(sb, ':');
	      }
	    }
	    lj_buf_putmem(sb, name, (MSize)strlen(name));
	    break;
	  }  /* else: can't derive a name, dump module:line. */
	  }
	  /* fallthrough */
	case 'l':  /* Dump module:line. */
	  if (isluafunc(fn)) {
	    GCproto *pt = funcproto(fn);
	    if (debug_putchunkname(sb, pt, pathstrip)) {
	      /* Regular Lua function. */
	      BCLine line = c == 'l' ? debug_frameline(L, fn, nextframe) :
				       pt->firstline;
	      lj_buf_putb(sb, ':');
	      lj_strfmt_putint(sb, line >= 0 ? line : pt->firstline);
	    }
	  } else if (isffunc(fn)) {  /* Dump numbered builtins. */
	    lj_buf_putmem(sb, "[builtin#", 9);
	    lj_strfmt_putint(sb, fn->c.ffid);
	    lj_buf_putb(sb, ']');
	  } else {  /* Dump C function address. */
	    lj_buf_putb(sb, '@');
	    lj_strfmt_putptr(sb, fn->c.f);
	  }
	  break;
	case 'Z':  /* Zap trailing separator. */
	  lastlen = sbuflen(sb);
	  break;
	default:
	  lj_buf_putb(sb, c);
	  break;
	}
      }
    } else if (dir == 1) {
      break;
    } else {
      level -= size;  /* Reverse frame order: quickly skip missing level. */
    }
    level += dir;
  }
  if (lastlen)
    sb->w = sb->b + lastlen;  /* Zap trailing separator. */
}